

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>>>
::
emplace<std::basic_string_view<char,std::char_traits<char>>const&,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key,convertible_to_value *args)

{
  EntryPointer psVar1;
  size_t __n;
  char *__s1;
  int iVar2;
  size_t sVar3;
  EntryPointer psVar4;
  EntryPointer current_entry;
  char distance_from_desired;
  size_type __rlen;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::ast::Definition_*,_bool>_>_>,_bool>
  pVar5;
  hash<std::basic_string_view<char,_std::char_traits<char>_>_> local_39;
  convertible_to_value *local_38;
  
  local_38 = args;
  sVar3 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (&local_39,key);
  current_entry =
       (EntryPointer)
       (*(long *)this + (sVar3 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x28);
  if (current_entry->distance_from_desired < '\0') {
    distance_from_desired = '\0';
  }
  else {
    __n = key->_M_len;
    __s1 = key->_M_str;
    distance_from_desired = '\0';
    psVar4 = current_entry;
    do {
      if ((__n == (psVar4->field_1).value.first._M_len) &&
         ((__n == 0 || (iVar2 = bcmp(__s1,(psVar4->field_1).value.first._M_str,__n), iVar2 == 0))))
      {
        pVar5._8_8_ = 0;
        pVar5.first.current = psVar4;
        return pVar5;
      }
      current_entry = psVar4 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar4 + 1;
      psVar4 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar5 = emplace_new_key<std::basic_string_view<char,std::char_traits<char>>const&,ska::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::ast::Definition_const*,bool>>>>::convertible_to_value>
                    (this,distance_from_desired,current_entry,key,local_38);
  return pVar5;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }